

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qauthenticator.cpp
# Opt level: O3

void qStreamNtlmString(QDataStream *ds,QString *s,bool unicode)

{
  long lVar1;
  char16_t *pcVar2;
  undefined7 in_register_00000011;
  long lVar3;
  long in_FS_OFFSET;
  QArrayData *local_40;
  undefined8 *local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((int)CONCAT71(in_register_00000011,unicode) == 0) {
    QString::toLatin1_helper((QString *)&local_40);
    if (local_38 == (undefined8 *)0x0) {
      local_38 = &QByteArray::_empty;
    }
    QDataStream::writeRawData((char *)ds,(longlong)local_38);
    if (local_40 != (QArrayData *)0x0) {
      LOCK();
      (local_40->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_40->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_40->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_40,1,0x10);
      }
    }
  }
  else {
    lVar1 = (s->d).size;
    if (lVar1 != 0) {
      pcVar2 = (s->d).ptr;
      lVar3 = 0;
      do {
        QDataStream::operator<<(ds,*(short *)((long)pcVar2 + lVar3));
        lVar3 = lVar3 + 2;
      } while (lVar1 * 2 != lVar3);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void qStreamNtlmString(QDataStream& ds, const QString& s, bool unicode)
{
    if (!unicode) {
        qStreamNtlmBuffer(ds, s.toLatin1());
        return;
    }

    for (QChar ch : s)
        ds << quint16(ch.unicode());
}